

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark-pump.c
# Opt level: O0

int run_helper_pipe_pump_server(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  int r;
  
  type = PIPE;
  loop = uv_default_loop();
  server = (uv_stream_t *)&pipeServer;
  iVar1 = uv_pipe_init(loop,&pipeServer,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/benchmark-pump.c"
            ,0x199,"r == 0");
    abort();
  }
  iVar1 = uv_pipe_bind(&pipeServer,"/tmp/uv-test-sock");
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/benchmark-pump.c"
            ,0x19b,"r == 0");
    abort();
  }
  iVar1 = uv_listen((uv_stream_t *)&pipeServer,1000,connection_cb);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/benchmark-pump.c"
            ,0x19d,"r == 0");
    abort();
  }
  notify_parent_process();
  uv_run(loop,UV_RUN_DEFAULT);
  puVar2 = uv_default_loop();
  close_loop(puVar2);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/benchmark-pump.c"
            ,0x1a2,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

HELPER_IMPL(pipe_pump_server) {
  int r;
  type = PIPE;

  loop = uv_default_loop();

  /* Server */
  server = (uv_stream_t*)&pipeServer;
  r = uv_pipe_init(loop, &pipeServer, 0);
  ASSERT(r == 0);
  r = uv_pipe_bind(&pipeServer, TEST_PIPENAME);
  ASSERT(r == 0);
  r = uv_listen((uv_stream_t*)&pipeServer, MAX_WRITE_HANDLES, connection_cb);
  ASSERT(r == 0);

  notify_parent_process();
  uv_run(loop, UV_RUN_DEFAULT);

  MAKE_VALGRIND_HAPPY();
  return 0;
}